

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O0

void duckdb::ConstructSortKeyStruct
               (SortKeyVectorData *vector_data,SortKeyChunk chunk,SortKeyConstructInfo *info)

{
  undefined1 uVar1;
  value_type vVar2;
  bool bVar3;
  long in_RSI;
  long in_RDI;
  vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
  *in_stack_00000008;
  vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
  *in_stack_00000010;
  bool in_stack_00000020;
  unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>
  *child_1;
  iterator __end2;
  iterator __begin2;
  vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_true>
  *__range2;
  SortKeyChunk child_chunk;
  unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true> *child
  ;
  iterator __end3;
  iterator __begin3;
  vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_true>
  *__range3;
  data_ptr_t result_ptr;
  value_type *offset;
  idx_t idx;
  idx_t result_index;
  idx_t r;
  unsafe_vector<idx_t> *offsets;
  bool list_of_structs;
  SortKeyConstructInfo *in_stack_000001e8;
  SortKeyVectorData *in_stack_000001f0;
  SortKeyChunk in_stack_00000200;
  vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
  *in_stack_fffffffffffffee8;
  vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
  *in_stack_fffffffffffffef0;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffef8;
  __normal_iterator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>_>
  local_b8;
  long local_b0;
  vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
  *local_a8;
  vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
  *local_a0;
  TemplatedValidityMask<unsigned_long> *local_98;
  bool local_90;
  undefined7 uStack_8f;
  SortKeyChunk local_88;
  reference local_68;
  unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>
  *local_60;
  __normal_iterator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>_>
  local_58;
  long local_50;
  long local_48;
  reference local_40;
  idx_t local_38;
  idx_t local_30;
  vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
  *local_28;
  undefined8 local_20;
  byte local_11;
  long local_10;
  long local_8;
  
  local_11 = in_stack_00000020 & 1;
  local_20 = *(undefined8 *)(in_RSI + 8);
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_28 = in_stack_00000008; local_28 < in_stack_00000010;
      local_28 = (vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
                  *)((long)&(local_28->
                            super__Vector_base<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1)) {
    local_30 = SortKeyChunk::GetResultIndex((SortKeyChunk *)&stack0x00000008,(idx_t)local_28);
    local_38 = SelectionVector::get_index(*(SelectionVector **)(local_8 + 0x10),(idx_t)local_28);
    local_40 = vector<unsigned_long,_false>::operator[]
                         ((vector<unsigned_long,_false> *)in_stack_fffffffffffffef0,
                          (size_type)in_stack_fffffffffffffee8);
    local_48 = *(long *)(*(long *)(local_10 + 0x10) + local_30 * 8);
    bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (in_stack_fffffffffffffef8,(idx_t)in_stack_fffffffffffffef0);
    if (bVar3) {
      uVar1 = *(undefined1 *)(local_8 + 0x71);
      vVar2 = *local_40;
      *local_40 = vVar2 + 1;
      *(undefined1 *)(local_48 + vVar2) = uVar1;
    }
    else {
      uVar1 = *(undefined1 *)(local_8 + 0x70);
      vVar2 = *local_40;
      *local_40 = vVar2 + 1;
      *(undefined1 *)(local_48 + vVar2) = uVar1;
    }
    if ((local_11 & 1) != 0) {
      local_50 = local_8 + 0x58;
      local_58._M_current =
           (unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>
            *)::std::
              vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
              ::begin(in_stack_fffffffffffffee8);
      local_60 = (unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>
                  *)::std::
                    vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
                    ::end(in_stack_fffffffffffffee8);
      while (bVar3 = __gnu_cxx::operator!=
                               ((__normal_iterator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>_>
                                 *)in_stack_fffffffffffffef0,
                                (__normal_iterator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>_>
                                 *)in_stack_fffffffffffffee8), bVar3) {
        local_68 = __gnu_cxx::
                   __normal_iterator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>_>
                   ::operator*(&local_58);
        SortKeyChunk::SortKeyChunk
                  (&local_88,(idx_t)local_28,
                   (idx_t)((long)&(local_28->
                                  super__Vector_base<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 1),local_30);
        unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>
        ::operator*((unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>
                     *)in_stack_fffffffffffffef0);
        local_a8 = (vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
                    *)local_88.start;
        local_a0 = (vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
                    *)local_88.end;
        local_98 = (TemplatedValidityMask<unsigned_long> *)local_88.result_index;
        local_90 = local_88.has_result_index;
        uStack_8f = local_88._25_7_;
        in_stack_fffffffffffffee8 =
             (vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
              *)local_88.start;
        in_stack_fffffffffffffef0 =
             (vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
              *)local_88.end;
        in_stack_fffffffffffffef8 = (TemplatedValidityMask<unsigned_long> *)local_88.result_index;
        ConstructSortKeyRecursive(in_stack_000001f0,in_stack_00000200,in_stack_000001e8);
        __gnu_cxx::
        __normal_iterator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>_>
        ::operator++(&local_58);
      }
    }
  }
  if ((local_11 & 1) == 0) {
    local_b0 = local_8 + 0x58;
    local_b8._M_current =
         (unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>
          *)::std::
            vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
            ::begin(in_stack_fffffffffffffee8);
    ::std::
    vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
    ::end(in_stack_fffffffffffffee8);
    while (bVar3 = __gnu_cxx::operator!=
                             ((__normal_iterator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>_>
                               *)in_stack_fffffffffffffef0,
                              (__normal_iterator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>_>
                               *)in_stack_fffffffffffffee8), bVar3) {
      __gnu_cxx::
      __normal_iterator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>_>
      ::operator*(&local_b8);
      unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>::
      operator*((unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>
                 *)in_stack_fffffffffffffef0);
      in_stack_fffffffffffffee8 = in_stack_00000008;
      in_stack_fffffffffffffef0 = in_stack_00000010;
      ConstructSortKeyRecursive(in_stack_000001f0,in_stack_00000200,in_stack_000001e8);
      __gnu_cxx::
      __normal_iterator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>_>
      ::operator++(&local_b8);
    }
  }
  return;
}

Assistant:

void ConstructSortKeyStruct(SortKeyVectorData &vector_data, SortKeyChunk chunk, SortKeyConstructInfo &info) {
	bool list_of_structs = chunk.has_result_index;
	// write the validity data of the struct
	auto &offsets = info.offsets;
	for (idx_t r = chunk.start; r < chunk.end; r++) {
		auto result_index = chunk.GetResultIndex(r);
		auto idx = vector_data.format.sel->get_index(r);
		auto &offset = offsets[result_index];
		auto result_ptr = info.result_data[result_index];
		if (!vector_data.format.validity.RowIsValid(idx)) {
			// NULL value - write the null byte and skip
			result_ptr[offset++] = vector_data.null_byte;
		} else {
			// valid value - write the validity byte
			result_ptr[offset++] = vector_data.valid_byte;
		}
		if (list_of_structs) {
			// for a list of structs we need to write the child data for every iteration
			// since the final layout needs to be
			// [struct1][struct2][...]
			for (auto &child : vector_data.child_data) {
				SortKeyChunk child_chunk(r, r + 1, result_index);
				ConstructSortKeyRecursive(*child, child_chunk, info);
			}
		}
	}
	if (!list_of_structs) {
		for (auto &child : vector_data.child_data) {
			ConstructSortKeyRecursive(*child, chunk, info);
		}
	}
}